

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

void P_CheckSplash(AActor *self,double distance)

{
  sector_t *psVar1;
  sector_t *floorsec;
  DVector3 pos;
  sector_t *local_38;
  double local_30;
  DVector3 local_28;
  
  local_30 = distance;
  sector_t::LowestFloorAt(self->Sector,self,&local_38);
  if (((self->__Pos).Z <= local_30 + self->floorz) && (self->floorsector == local_38)) {
    psVar1 = sector_t::GetHeightSec(self->Sector);
    if ((psVar1 == (sector_t *)0x0) && (local_38->heightsec == (sector_t *)0x0)) {
      AActor::PosRelative(&local_28,self,local_38);
      local_28.Z = self->floorz;
      P_HitWater(self,local_38,&local_28,false,false,false);
    }
  }
  return;
}

Assistant:

void P_CheckSplash(AActor *self, double distance)
{
	sector_t *floorsec;
	self->Sector->LowestFloorAt(self, &floorsec);
	if (self->Z() <= self->floorz + distance && self->floorsector == floorsec && self->Sector->GetHeightSec() == NULL && floorsec->heightsec == NULL)
	{
		// Explosion splashes never alert monsters. This is because A_Explode has
		// a separate parameter for that so this would get in the way of proper 
		// behavior.
		DVector3 pos = self->PosRelative(floorsec);
		pos.Z = self->floorz;
		P_HitWater (self, floorsec, pos, false, false);
	}
}